

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyParserColour.cpp
# Opt level: O0

void Rml::HSLAToRGBA(Array<float,_4> *vals)

{
  value_type_conflict2 vVar1;
  float l_00;
  reference pvVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float l;
  float s;
  float h;
  Array<float,_4> *vals_local;
  
  pvVar2 = ::std::array<float,_4UL>::operator[](vals,1);
  if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,0);
    dVar5 = ::std::fmod((double)(ulong)(uint)*pvVar2,5.61194321426546e-315);
    l = SUB84(dVar5,0);
    if (l < 0.0) {
      l = l + 360.0;
    }
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,1);
    fVar4 = *pvVar2;
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,2);
    l_00 = *pvVar2;
    fVar3 = HSL_f(l,fVar4,l_00,0.0);
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,0);
    *pvVar2 = fVar3;
    fVar3 = HSL_f(l,fVar4,l_00,8.0);
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,1);
    *pvVar2 = fVar3;
    fVar4 = HSL_f(l,fVar4,l_00,4.0);
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,2);
    *pvVar2 = fVar4;
  }
  else {
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,2);
    vVar1 = *pvVar2;
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,1);
    *pvVar2 = vVar1;
    pvVar2 = ::std::array<float,_4UL>::operator[](vals,0);
    *pvVar2 = vVar1;
  }
  return;
}

Assistant:

static void HSLAToRGBA(Array<float, 4>& vals)
{
	if (vals[1] == 0.0f)
	{
		vals[0] = vals[1] = vals[2];
	}
	else
	{
		float h = std::fmod(vals[0], 360.0f);
		if (h < 0)
			h += 360.0f;
		float s = vals[1];
		float l = vals[2];
		vals[0] = HSL_f(h, s, l, 0.0f);
		vals[1] = HSL_f(h, s, l, 8.0f);
		vals[2] = HSL_f(h, s, l, 4.0f);
	}
}